

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O2

void __thiscall crnlib::well512::seed(well512 *this,uint32 seed1,uint32 seed2,uint32 seed3)

{
  uint uVar1;
  uint i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    uVar1 = seed2 << 0x11 ^ seed2;
    uVar1 = uVar1 >> 0xd ^ uVar1;
    seed2 = uVar1 << 5 ^ uVar1;
    seed1 = bitmix32c(seed1);
    seed3 = seed3 * 0x10dcd + 0x12d687;
    this->m_state[lVar2] = seed1 ^ seed3 ^ seed2;
  }
  this->m_index = 0;
  return;
}

Assistant:

void well512::seed(uint32 seed1, uint32 seed2, uint32 seed3) {
  uint32 jsr = seed2;
  uint32 jcong = seed3;

  for (uint i = 0; i < cStateSize; i++) {
    SHR3;
    seed1 = bitmix32c(seed1);
    CONG;

    m_state[i] = seed1 ^ jsr ^ jcong;
  }
  m_index = 0;
}